

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.cpp
# Opt level: O3

void __thiscall IrSim::getFunctions(IrSim *this,vector<int,_std::allocator<int>_> *f)

{
  iterator iVar1;
  undefined4 uVar2;
  int iVar3;
  undefined8 in_RAX;
  _Rb_tree_node_base *p_Var4;
  undefined8 uStack_28;
  
  p_Var4 = (this->functions)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  uStack_28 = in_RAX;
  uVar2 = (int)in_RAX;
  while ((_Rb_tree_header *)p_Var4 != &(this->functions)._M_t._M_impl.super__Rb_tree_header) {
    iVar1._M_current =
         (f->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
         _M_finish;
    if (iVar1._M_current ==
        (f->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
        _M_end_of_storage) {
      std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                ((vector<int,std::allocator<int>> *)f,iVar1,(int *)(p_Var4 + 1));
    }
    else {
      *iVar1._M_current = p_Var4[1]._M_color;
      (f->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_finish =
           iVar1._M_current + 1;
    }
    p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4);
    uVar2 = (undefined4)uStack_28;
  }
  iVar3 = (int)((ulong)((long)(this->irList).
                              super__Vector_base<InterCode,_std::allocator<InterCode>_>._M_impl.
                              super__Vector_impl_data._M_finish -
                       (long)(this->irList).
                             super__Vector_base<InterCode,_std::allocator<InterCode>_>._M_impl.
                             super__Vector_impl_data._M_start) >> 3) * 0x286bca1b;
  uStack_28 = CONCAT44(iVar3,uVar2);
  iVar1._M_current =
       (f->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_finish;
  if (iVar1._M_current ==
      (f->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
              (f,iVar1,(int *)((long)&uStack_28 + 4));
  }
  else {
    *iVar1._M_current = iVar3;
    (f->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_finish =
         iVar1._M_current + 1;
  }
  return;
}

Assistant:

void IrSim::getFunctions(vector<int> &f) {
    for (auto &i : functions)
        f.push_back(i);
    f.push_back((int)irList.size());
}